

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

void analyze_C_types(C_Decl_Analysis *analysis,C_Type *ty)

{
  Ravi_CompilerInterface *pRVar1;
  C_Member *local_28;
  C_Member *mem;
  Ravi_CompilerInterface *api;
  C_Type *ty_local;
  C_Decl_Analysis *analysis_local;
  
  pRVar1 = analysis->api;
  if (ty->kind == TY_STRUCT) {
    for (local_28 = ty->members; local_28 != (C_Member *)0x0; local_28 = local_28->next) {
      analyze_C_types(analysis,local_28->ty);
    }
  }
  else if (ty->kind == TY_PTR) {
    (*pRVar1->error_message)(pRVar1->context,"Declaring pointer type is not allowed\n");
    analysis->status = analysis->status + -1;
  }
  else if (ty->kind == TY_UNION) {
    (*pRVar1->error_message)(pRVar1->context,"Declaring union type is not allowed\n");
    analysis->status = analysis->status + -1;
  }
  return;
}

Assistant:

static void analyze_C_types(C_Decl_Analysis *analysis, C_Type *ty)
{
	struct Ravi_CompilerInterface *api = analysis->api;
	if (ty->kind == TY_STRUCT) {
		for (C_Member *mem = ty->members; mem; mem = mem->next) {
			analyze_C_types(analysis, mem->ty);
		}
	} else if (ty->kind == TY_PTR) {
		api->error_message(api->context, "Declaring pointer type is not allowed\n");
		analysis->status--;
	} else if (ty->kind == TY_UNION) {
		api->error_message(api->context, "Declaring union type is not allowed\n");
		analysis->status--;
	}
}